

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.cpp
# Opt level: O0

bool rpn_IsDiffConstant(Expression *src,Symbol *sym)

{
  Symbol *sym_00;
  Section *pSVar1;
  Section *pSVar2;
  bool local_39;
  Section *section2;
  Section *section1;
  Symbol *sym1;
  Symbol *sym_local;
  Expression *src_local;
  
  sym_00 = rpn_SymbolOf(src);
  if ((((sym_00 == (Symbol *)0x0) || (sym == (Symbol *)0x0)) || (sym_00->type != SYM_LABEL)) ||
     (sym->type != SYM_LABEL)) {
    src_local._7_1_ = false;
  }
  else {
    pSVar1 = sym_GetSection(sym_00);
    pSVar2 = sym_GetSection(sym);
    local_39 = pSVar1 != (Section *)0x0 && pSVar1 == pSVar2;
    src_local._7_1_ = local_39;
  }
  return src_local._7_1_;
}

Assistant:

bool rpn_IsDiffConstant(struct Expression const *src, struct Symbol const *sym)
{
	// Check if both expressions only refer to a single symbol
	struct Symbol const *sym1 = rpn_SymbolOf(src);

	if (!sym1 || !sym || sym1->type != SYM_LABEL || sym->type != SYM_LABEL)
		return false;

	struct Section const *section1 = sym_GetSection(sym1);
	struct Section const *section2 = sym_GetSection(sym);
	return section1 && (section1 == section2);
}